

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

char * __thiscall OSToken::index(OSToken *this,char *__s,int __c)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  pointer pbVar4;
  size_type sVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pbVar6;
  long lVar7;
  reference pbVar8;
  ulong uVar9;
  MutexLocker *pMVar10;
  reference ppOVar11;
  iterator this_01;
  size_type sVar12;
  undefined8 extraout_RAX;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar13;
  pair<std::_Rb_tree_const_iterator<OSObject_*>,_bool> pVar14;
  ObjectFile *fileObject;
  iterator i_4;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> newObjects;
  ObjectFile *newObject;
  string lockName;
  iterator i_3;
  iterator i_2;
  iterator i_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  removedFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedFiles;
  iterator i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenFiles;
  MutexLocker lock;
  Mutex *in_stack_fffffffffffffb28;
  MutexLocker *in_stack_fffffffffffffb30;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  _Rb_tree_const_iterator<OSObject_*> in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  byte in_stack_fffffffffffffb4f;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb50;
  Directory *in_stack_fffffffffffffb58;
  long local_4a0;
  char *pcVar15;
  undefined1 isNew;
  undefined6 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  _Self *in_stack_fffffffffffffbb8;
  pointer in_stack_fffffffffffffbc0;
  OSToken *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  byte bVar16;
  byte bVar17;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  bool local_3bb;
  string local_398 [16];
  Directory *in_stack_fffffffffffffc78;
  _Self local_378;
  string local_370 [32];
  _Self local_350;
  string local_348 [32];
  long local_328;
  _Self local_320;
  _Self local_318 [7];
  _Base_ptr local_2e0;
  _Base_ptr local_2d8;
  undefined1 local_2d0;
  MutexLocker *local_2c8;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  MutexLocker *local_2b0;
  string local_2a8 [39];
  undefined1 local_281;
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [16];
  string local_1d0 [32];
  _Self local_1b0;
  _Self local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  undefined1 local_190;
  _Self local_188;
  _Self local_180;
  _Self local_178;
  _Self local_170;
  _Base_ptr local_168;
  _Base_ptr local_160;
  undefined1 local_158;
  _Self local_150;
  _Self local_148;
  _Self local_140;
  _Self local_138 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  _Base_ptr local_c8;
  undefined1 local_c0;
  byte local_b1;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88 [10];
  undefined4 local_38;
  byte local_11;
  OSToken *local_10;
  undefined1 local_1;
  
  local_11 = (byte)__s & 1;
  local_10 = this;
  MutexLocker::MutexLocker(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  if (((local_11 & 1) != 0) ||
     (((this->valid & 1U) != 0 &&
      (bVar1 = Generation::wasUpdated
                         ((Generation *)
                          CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28)), bVar1))))
  {
    bVar1 = Directory::refresh(in_stack_fffffffffffffc78);
    if ((bVar1) && ((this->tokenObject->valid & 1U) != 0)) {
      uVar3 = std::__cxx11::string::c_str();
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x260,"Token %s has changed",uVar3);
      Directory::getFiles_abi_cxx11_(in_stack_fffffffffffffb58);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x1dc5b0);
      local_88[0]._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb28);
      while( true ) {
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffb28);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffb30,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffb28);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(local_88);
        uVar9 = std::__cxx11::string::size();
        local_b1 = 0;
        local_3bb = false;
        if (7 < uVar9) {
          pbVar4 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator->(local_88);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(local_88);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_b0,(ulong)pbVar4);
          local_b1 = 1;
          iVar2 = std::__cxx11::string::compare((char *)local_b0);
          local_3bb = false;
          if (iVar2 == 0) {
            pbVar4 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator->(local_88);
            iVar2 = std::__cxx11::string::compare((char *)pbVar4);
            local_3bb = iVar2 != 0;
          }
        }
        if ((local_b1 & 1) != 0) {
          std::__cxx11::string::~string(local_b0);
        }
        if ((local_3bb & 1U) == 0) {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(local_88);
          uVar3 = std::__cxx11::string::c_str();
          softHSMLog(7,"index",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x272,"Ignored file %s",uVar3);
        }
        else {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(local_88);
          pVar13 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert(in_stack_fffffffffffffb50,
                            (value_type *)
                            CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
          local_c8 = (_Base_ptr)pVar13.first._M_node;
          local_c0 = pVar13.second;
        }
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                                (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x1dc7df);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x1dc7ec);
      if ((local_11 & 1) == 0) {
        local_138[0]._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb28);
        while( true ) {
          local_140._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb28);
          bVar1 = std::operator!=(local_138,&local_140);
          if (!bVar1) break;
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x1dc865);
          local_148._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                      (key_type *)in_stack_fffffffffffffb30);
          local_150._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb28);
          bVar1 = std::operator==(&local_148,&local_150);
          if (bVar1) {
            std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x1dc8d3);
            pVar13 = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert(in_stack_fffffffffffffb50,
                              (value_type *)
                              CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
            local_160 = (_Base_ptr)pVar13.first._M_node;
            local_158 = pVar13.second;
          }
          local_168 = (_Base_ptr)
                      std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                                   (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
        }
        local_170._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb28);
        while( true ) {
          local_178._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb28);
          bVar1 = std::operator!=(&local_170,&local_178);
          if (!bVar1) break;
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x1dc9ae);
          local_180._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                      (key_type *)in_stack_fffffffffffffb30);
          local_188._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb28);
          bVar1 = std::operator==(&local_180,&local_188);
          if (bVar1) {
            std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x1dca15);
            pVar13 = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert(in_stack_fffffffffffffb50,
                              (value_type *)
                              CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
            local_198 = (_Base_ptr)pVar13.first._M_node;
            local_190 = pVar13.second;
          }
          local_1a0 = (_Base_ptr)
                      std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                                   (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
        }
      }
      else {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb30,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb28);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffb30,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffb28);
      sVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x1dcab8);
      this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x1dcacd);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x295,"%d objects were added and %d objects were removed",sVar5);
      sVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x1dcb1a);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x296,"Current directory set contains %d objects",sVar5);
      local_1a8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
      while( true ) {
        local_1b0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
        bVar1 = std::operator!=(&local_1a8,&local_1b0);
        if (!bVar1) break;
        pbVar6 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x1dcb9a);
        lVar7 = std::__cxx11::string::find_last_of((char)pbVar6,0x2e);
        bVar16 = 1;
        bVar17 = bVar16;
        if (lVar7 != -1) {
          in_stack_fffffffffffffbb8 = &local_1a8;
          in_stack_fffffffffffffbc0 =
               std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x1dcbe1);
          pbVar6 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)0x1dcbf6);
          in_stack_fffffffffffffbc8 = (OSToken *)0xffffffffffffffff;
          std::__cxx11::string::find_last_of((char)pbVar6,0x2e);
          std::__cxx11::string::substr((ulong)local_1d0,(ulong)in_stack_fffffffffffffbc0);
          bVar16 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffb30,(char *)this_00);
          in_stack_fffffffffffffbb7 = bVar16;
          bVar17 = bVar16;
          std::__cxx11::string::~string(local_1d0);
        }
        if ((bVar16 & 1) == 0) {
          pbVar8 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)0x1dcce1);
          std::__cxx11::string::string((string *)&stack0xfffffffffffffe08,(string *)pbVar8);
          pcVar15 = (char *)0xffffffffffffffff;
          uVar9 = std::__cxx11::string::find_last_of((char)&stack0xfffffffffffffe08,0x2e);
          std::__cxx11::string::replace((ulong)&stack0xfffffffffffffe08,uVar9,pcVar15);
          isNew = (undefined1)((ulong)pcVar15 >> 0x38);
          pMVar10 = (MutexLocker *)operator_new(0xb0);
          local_281 = 1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x1dcd7f);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb30);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb30);
          ObjectFile::ObjectFile
                    ((ObjectFile *)CONCAT17(bVar17,in_stack_fffffffffffffbd0),
                     in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                     (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffbb7,CONCAT16(bVar16,in_stack_fffffffffffffbb0)),
                     (bool)isNew);
          local_281 = 0;
          std::__cxx11::string::~string(local_260);
          std::__cxx11::string::~string(local_280);
          std::__cxx11::string::~string(local_220);
          std::__cxx11::string::~string(local_240);
          ObjectFile::getFilename_abi_cxx11_
                    ((ObjectFile *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
          in_stack_fffffffffffffb30 = pMVar10;
          this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)std::__cxx11::string::c_str();
          pMVar10 = in_stack_fffffffffffffb30;
          softHSMLog(7,"index",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x2ac,"(0x%08X) New object %s (0x%08X) added",this);
          std::__cxx11::string::~string(local_2a8);
          local_2b0 = pMVar10;
          pMVar10 = local_2b0;
          pVar14 = std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::insert
                             ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *
                              )in_stack_fffffffffffffb50,
                              (value_type *)
                              CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
          local_2c8 = pMVar10;
          local_2c0 = (_Base_ptr)pVar14.first._M_node;
          local_2b8 = pVar14.second;
          pVar14 = std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::insert
                             ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *
                              )in_stack_fffffffffffffb50,
                              (value_type *)
                              CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
          local_2d8 = (_Base_ptr)pVar14.first._M_node;
          local_2d0 = pVar14.second;
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
        }
        local_2e0 = (_Base_ptr)
                    std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                                 (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
      }
      std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::set
                ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)0x1dd0a3);
      local_318[0]._M_node =
           (_Base_ptr)
           std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::begin
                     ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)this_00
                     );
      while( true ) {
        local_320._M_node =
             (_Base_ptr)
             std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::end
                       ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                        this_00);
        bVar1 = std::operator!=(local_318,&local_320);
        if (!bVar1) break;
        ppOVar11 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                             ((_Rb_tree_const_iterator<OSObject_*> *)in_stack_fffffffffffffb30);
        if (*ppOVar11 == (OSObject *)0x0) {
          local_4a0 = 0;
        }
        else {
          local_4a0 = __dynamic_cast(*ppOVar11,&OSObject::typeinfo,&ObjectFile::typeinfo,0);
        }
        local_328 = local_4a0;
        if (local_4a0 == 0) {
          ppOVar11 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                               ((_Rb_tree_const_iterator<OSObject_*> *)in_stack_fffffffffffffb30);
          softHSMLog(3,"index",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x2b9,"Object type not compatible with this token class 0x%08X",*ppOVar11);
          local_1 = 0;
          goto LAB_001dd468;
        }
        ObjectFile::getFilename_abi_cxx11_
                  ((ObjectFile *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
        uVar3 = std::__cxx11::string::c_str();
        ppOVar11 = std::_Rb_tree_const_iterator<OSObject_*>::operator*
                             ((_Rb_tree_const_iterator<OSObject_*> *)in_stack_fffffffffffffb30);
        this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)*ppOVar11;
        softHSMLog(7,"index",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x2be,"Processing %s (0x%08X)",uVar3);
        std::__cxx11::string::~string(local_348);
        ObjectFile::getFilename_abi_cxx11_
                  ((ObjectFile *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
        this_01 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                         (key_type *)in_stack_fffffffffffffb30);
        local_350._M_node = this_01._M_node;
        local_378._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
        in_stack_fffffffffffffb4f = std::operator==(&local_350,&local_378);
        std::__cxx11::string::~string(local_370);
        if ((in_stack_fffffffffffffb4f & 1) == 0) {
          ObjectFile::invalidate((ObjectFile *)0x1dd3dc);
        }
        else {
          ObjectFile::getFilename_abi_cxx11_
                    ((ObjectFile *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
          uVar3 = std::__cxx11::string::c_str();
          softHSMLog(7,"index",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x2c2,"Adding object %s",uVar3);
          std::__cxx11::string::~string(local_398);
          std::_Rb_tree_const_iterator<OSObject_*>::operator*
                    ((_Rb_tree_const_iterator<OSObject_*> *)in_stack_fffffffffffffb30);
          pVar14 = std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::insert
                             ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *
                              )this_01._M_node,
                              (value_type *)
                              CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
          in_stack_fffffffffffffb40 = pVar14.first._M_node;
          in_stack_fffffffffffffb3f = pVar14.second;
        }
        std::_Rb_tree_const_iterator<OSObject_*>::operator++
                  ((_Rb_tree_const_iterator<OSObject_*> *)
                   CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                   (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
      }
      std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::operator=
                ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                 in_stack_fffffffffffffb30,
                 (set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)this_00);
      sVar12 = std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::size
                         ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                          0x1dd42a);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x2cf,"The token now contains %d objects",sVar12);
      local_1 = 1;
LAB_001dd468:
      local_38 = 1;
      std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::~set
                ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)0x1dd475);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1dd482);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1dd48f);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1dd49c);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb40._M_node);
    }
    else {
      softHSMLog(3,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x259,"Token integrity check failed");
      this->valid = false;
      local_1 = 0;
      local_38 = 1;
    }
  }
  else {
    softHSMLog(7,"index",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,0x251,"No re-indexing is required");
    local_1 = 1;
    local_38 = 1;
  }
  MutexLocker::~MutexLocker(in_stack_fffffffffffffb30);
  return (char *)(CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1) & 0xffffffffffffff01);
}

Assistant:

bool OSToken::index(bool isFirstTime /* = false */)
{
	// No access to object mutable fields before
	MutexLocker lock(tokenMutex);

	// Check if re-indexing is required
	if (!isFirstTime && (!valid || !gen->wasUpdated()))
	{
		DEBUG_MSG("No re-indexing is required");

		return true;
	}

	// Check the integrity
	if (!tokenDir->refresh() || !tokenObject->valid)
	{
		ERROR_MSG("Token integrity check failed");

		valid = false;

		return false;
	}

	DEBUG_MSG("Token %s has changed", tokenPath.c_str());

	// Retrieve the directory listing
	std::vector<std::string> tokenFiles = tokenDir->getFiles();

	// Filter out the objects
	std::set<std::string> newSet;

	for (std::vector<std::string>::iterator i = tokenFiles.begin(); i != tokenFiles.end(); i++)
	{
		if ((i->size() > 7) &&
		    (!(i->substr(i->size() - 7).compare(".object"))) &&
		    (i->compare("token.object")))
		{
			newSet.insert(*i);
		}
		else
		{
			DEBUG_MSG("Ignored file %s", i->c_str());
		}
	}

	// Compute the changes compared to the last list of files
	std::set<std::string> addedFiles;
	std::set<std::string> removedFiles;

	if (!isFirstTime)
	{
		// First compute which files were added
		for (std::set<std::string>::iterator i = newSet.begin(); i != newSet.end(); i++)
		{
			if (currentFiles.find(*i) == currentFiles.end())
			{
				addedFiles.insert(*i);
			}
		}

		// Now compute which files were removed
		for (std::set<std::string>::iterator i = currentFiles.begin(); i != currentFiles.end(); i++)
		{
			if (newSet.find(*i) == newSet.end())
			{
				removedFiles.insert(*i);
			}
		}
	}
	else
	{
		addedFiles = newSet;
	}

	currentFiles = newSet;

	DEBUG_MSG("%d objects were added and %d objects were removed", addedFiles.size(), removedFiles.size());
	DEBUG_MSG("Current directory set contains %d objects", currentFiles.size());

	// Now update the set of objects

	// Add new objects
	for (std::set<std::string>::iterator i = addedFiles.begin(); i != addedFiles.end(); i++)
	{
		if ((i->find_last_of('.') == std::string::npos) ||
		    (i->substr(i->find_last_of('.')) != ".object"))
		{
			continue;
		}

		std::string lockName(*i);
		lockName.replace(lockName.find_last_of('.'), std::string::npos, ".lock");

		// Create a new token object for the added file
		ObjectFile* newObject = new ObjectFile(this, tokenPath + OS_PATHSEP + *i, umask, tokenPath + OS_PATHSEP + lockName);

		// Add the object, even invalid ones.
		// This is so the we can read the attributes once
		// the other process has finished writing to disc.
		DEBUG_MSG("(0x%08X) New object %s (0x%08X) added", this, newObject->getFilename().c_str(), newObject);
		objects.insert(newObject);
		allObjects.insert(newObject);
	}

	// Remove deleted objects
	std::set<OSObject*> newObjects;

	for (std::set<OSObject*>::iterator i = objects.begin(); i != objects.end(); i++)
	{
		ObjectFile* fileObject = dynamic_cast<ObjectFile*>((*i));
		if (fileObject == NULL)
		{
			ERROR_MSG("Object type not compatible with this token class 0x%08X", (*i));

			return false;
		}

		DEBUG_MSG("Processing %s (0x%08X)", fileObject->getFilename().c_str(), *i);

		if (removedFiles.find(fileObject->getFilename()) == removedFiles.end())
		{
			DEBUG_MSG("Adding object %s", fileObject->getFilename().c_str());
			// This object gets to stay in the set
			newObjects.insert(*i);
		}
		else
		{
			fileObject->invalidate();
		}
	}

	// Set the new objects
	objects = newObjects;

	DEBUG_MSG("The token now contains %d objects", objects.size());

	return true;
}